

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

void scr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = env->features;
  uVar2 = (uint)uVar1;
  uVar3 = 0x3fbf;
  if ((uVar2 >> 0x1c & 1) == 0) {
    uVar3 = 0x33ff;
  }
  uVar4 = uVar3;
  if ((((uVar1 >> 0x20 & 1) == 0) && (uVar4 = uVar3 & 0x3eff, (uVar1 & 0x20) != 0)) &&
     ((uVar2 >> 0x1b & 1) == 0)) {
    uVar4 = uVar3 & 15999;
  }
  uVar3 = uVar4 + 0x4000;
  if ((env[1].xregs[0x15] & 0xf0000) == 0) {
    uVar3 = uVar4;
  }
  uVar4 = uVar3 + 0x30000;
  if ((env[1].xregs[0x11] & 0xff000ff0) == 0) {
    uVar4 = uVar3;
  }
  uVar3 = (uint)value | 0x30;
  if ((uVar2 >> 0x1c & 1) == 0) {
    uVar3 = (uint)value;
  }
  raw_write(env,ri,(ulong)(uVar3 & uVar4));
  return;
}

Assistant:

static inline int arm_feature(CPUARMState *env, int feature)
{
    return (env->features & (1ULL << feature)) != 0;
}